

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

void * yang_read_when(lys_module *module,lys_node *node,yytokentype type,char *value)

{
  lys_node *__ptr;
  LY_ERR *pLVar1;
  char *pcVar2;
  lys_when *retval;
  char *value_local;
  yytokentype type_local;
  lys_node *node_local;
  lys_module *module_local;
  
  __ptr = (lys_node *)calloc(1,0x28);
  if (__ptr == (lys_node *)0x0) {
    pLVar1 = ly_errno_location();
    *pLVar1 = LY_EMEM;
    ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_when");
    free(value);
    return (void *)0x0;
  }
  pcVar2 = transform_schema2json(module,value);
  __ptr->name = pcVar2;
  if (__ptr->name != (char *)0x0) {
    switch(type) {
    case ANYXML_KEYWORD:
    case ANYDATA_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      pcVar2 = "anydata";
      if (type == ANYXML_KEYWORD) {
        pcVar2 = "anyxml";
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when",pcVar2);
      break;
    default:
      break;
    case AUGMENT_KEYWORD:
      if (node->next == (lys_node *)0x0) {
        node->next = __ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","augment");
      break;
    case CASE_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","case");
      break;
    case CHOICE_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","choice");
      break;
    case CONTAINER_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","container");
      break;
    case LEAF_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","leaf");
      break;
    case LEAF_LIST_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","leaflist");
      break;
    case LIST_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","list");
      break;
    case USES_KEYWORD:
      if (node[1].name == (char *)0x0) {
        node[1].name = (char *)__ptr;
        goto LAB_0016c965;
      }
      ly_vlog(LYE_TOOMANY,LY_VLOG_LYS,node,"when","uses");
      break;
    case EXTENSION_INSTANCE:
      node->name = (char *)__ptr;
LAB_0016c965:
      free(value);
      return __ptr;
    }
  }
  free(value);
  lydict_remove(module->ctx,__ptr->name);
  free(__ptr);
  return (void *)0x0;
}

Assistant:

void *
yang_read_when(struct lys_module *module, struct lys_node *node, enum yytokentype type, char *value)
{
    struct lys_when *retval;

    retval = calloc(1, sizeof *retval);
    if (!retval) {
        LOGMEM;
        free(value);
        return NULL;
    }
    retval->cond = transform_schema2json(module, value);
    if (!retval->cond) {
        goto error;
    }
    switch (type) {
    case CONTAINER_KEYWORD:
        if (((struct lys_node_container *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "container");
            goto error;
        }
        ((struct lys_node_container *)node)->when = retval;
        break;
    case ANYDATA_KEYWORD:
    case ANYXML_KEYWORD:
        if (((struct lys_node_anydata *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", (type == ANYXML_KEYWORD) ? "anyxml" : "anydata");
            goto error;
        }
        ((struct lys_node_anydata *)node)->when = retval;
        break;
    case CHOICE_KEYWORD:
        if (((struct lys_node_choice *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "choice");
            goto error;
        }
        ((struct lys_node_choice *)node)->when = retval;
        break;
    case CASE_KEYWORD:
        if (((struct lys_node_case *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "case");
            goto error;
        }
        ((struct lys_node_case *)node)->when = retval;
        break;
    case LEAF_KEYWORD:
        if (((struct lys_node_leaf *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaf");
            goto error;
        }
        ((struct lys_node_leaf *)node)->when = retval;
        break;
    case LEAF_LIST_KEYWORD:
        if (((struct lys_node_leaflist *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "leaflist");
            goto error;
        }
        ((struct lys_node_leaflist *)node)->when = retval;
        break;
    case LIST_KEYWORD:
        if (((struct lys_node_list *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "list");
            goto error;
        }
        ((struct lys_node_list *)node)->when = retval;
        break;
    case USES_KEYWORD:
        if (((struct lys_node_uses *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "uses");
            goto error;
        }
        ((struct lys_node_uses *)node)->when = retval;
        break;
    case AUGMENT_KEYWORD:
        if (((struct lys_node_augment *)node)->when) {
            LOGVAL(LYE_TOOMANY, LY_VLOG_LYS, node, "when", "augment");
            goto error;
        }
        ((struct lys_node_augment *)node)->when = retval;
        break;
    case EXTENSION_INSTANCE:
        *(struct lys_when **)node = retval;
        break;
    default:
        goto error;
        break;
    }
    free(value);
    return retval;

error:
    free(value);
    lydict_remove(module->ctx, retval->cond);
    free(retval);
    return NULL;
}